

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_handler(int signum)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  bool bVar5;
  int r;
  int saved_errno;
  uv_signal_t *handle;
  uv__signal_msg_t msg;
  int signum_local;
  
  msg._12_4_ = signum;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  memset(&handle,0,0x10);
  iVar2 = uv__signal_lock();
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    return;
  }
  _r = uv__signal_first_handle(msg._12_4_);
  while( true ) {
    bVar5 = false;
    if (_r != (uv_signal_s *)0x0) {
      bVar5 = _r->signum == msg._12_4_;
    }
    if (!bVar5) {
      uv__signal_unlock();
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      return;
    }
    msg.handle._0_4_ = msg._12_4_;
    handle = _r;
    do {
      sVar4 = write(_r->loop->signal_pipefd[1],&handle,0x10);
      iVar2 = (int)sVar4;
      bVar5 = false;
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        bVar5 = *piVar3 == 4;
      }
    } while (bVar5);
    if ((iVar2 != 0x10) &&
       ((iVar2 != -1 ||
        ((piVar3 = __errno_location(), *piVar3 != 0xb &&
         (piVar3 = __errno_location(), *piVar3 != 0xb)))))) break;
    if (iVar2 != -1) {
      _r->caught_signals = _r->caught_signals + 1;
    }
    _r = uv__signal_tree_s_RB_NEXT(_r);
  }
  __assert_fail("r == sizeof msg || (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                ,0xd3,"void uv__signal_handler(int)");
}

Assistant:

static void uv__signal_handler(int signum) {
  uv__signal_msg_t msg;
  uv_signal_t* handle;
  int saved_errno;

  saved_errno = errno;
  memset(&msg, 0, sizeof msg);

  if (uv__signal_lock()) {
    errno = saved_errno;
    return;
  }

  for (handle = uv__signal_first_handle(signum);
       handle != NULL && handle->signum == signum;
       handle = RB_NEXT(uv__signal_tree_s, &uv__signal_tree, handle)) {
    int r;

    msg.signum = signum;
    msg.handle = handle;

    /* write() should be atomic for small data chunks, so the entire message
     * should be written at once. In theory the pipe could become full, in
     * which case the user is out of luck.
     */
    do {
      r = write(handle->loop->signal_pipefd[1], &msg, sizeof msg);
    } while (r == -1 && errno == EINTR);

    assert(r == sizeof msg ||
           (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)));

    if (r != -1)
      handle->caught_signals++;
  }

  uv__signal_unlock();
  errno = saved_errno;
}